

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::InstanceIntersectorK<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  undefined4 uVar2;
  size_t sVar3;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar4;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar5;
  NodeRef nodeRef;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  Primitive *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar9;
  ulong uVar10;
  NodeRef *pNVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  undefined1 auVar15 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar16 [64];
  vint4 ai_2;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar30;
  float fVar31;
  vint4 ai;
  float fVar32;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vint4 ai_1;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 ai_3;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 bi_1;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 bi_3;
  undefined1 auVar42 [16];
  vint4 bi_2;
  undefined1 auVar43 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar54 [64];
  Precalculations pre;
  vint4 bi_8;
  undefined1 local_1798 [16];
  vbool<4> valid0;
  InstanceIntersectorK<4> local_16e8 [16];
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar26 = vpcmpeqd_avx(in_ZMM9._0_16_,in_ZMM9._0_16_);
    auVar44 = ZEXT1664(auVar26);
    auVar28 = vpcmpeqd_avx(auVar26,(undefined1  [16])valid_i->field_0);
    auVar20 = ZEXT816(0) << 0x40;
    auVar15 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar20,5);
    auVar48 = auVar28 & auVar15;
    if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar48[0xf] < '\0')
    {
      auVar15 = vandps_avx(auVar15,auVar28);
      auVar45 = ZEXT1664(auVar15);
      auVar46 = ZEXT1664(*(undefined1 (*) [16])ray);
      auVar47 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
      auVar33._8_4_ = 0x7fffffff;
      auVar33._0_8_ = 0x7fffffff7fffffff;
      auVar33._12_4_ = 0x7fffffff;
      auVar28 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar33);
      auVar38._8_4_ = 0x219392ef;
      auVar38._0_8_ = 0x219392ef219392ef;
      auVar38._12_4_ = 0x219392ef;
      auVar28 = vcmpps_avx(auVar28,auVar38,1);
      auVar48 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar38,auVar28);
      auVar28 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar33);
      auVar28 = vcmpps_avx(auVar28,auVar38,1);
      auVar21 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar38,auVar28);
      auVar28 = vrcpps_avx(auVar48);
      fVar27 = auVar28._0_4_;
      auVar36._0_4_ = auVar48._0_4_ * fVar27;
      fVar30 = auVar28._4_4_;
      auVar36._4_4_ = auVar48._4_4_ * fVar30;
      fVar31 = auVar28._8_4_;
      auVar36._8_4_ = auVar48._8_4_ * fVar31;
      fVar32 = auVar28._12_4_;
      auVar36._12_4_ = auVar48._12_4_ * fVar32;
      auVar43._8_4_ = 0x3f800000;
      auVar43._0_8_ = &DAT_3f8000003f800000;
      auVar43._12_4_ = 0x3f800000;
      auVar36 = vsubps_avx(auVar43,auVar36);
      auVar28 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar33);
      auVar28 = vcmpps_avx(auVar28,auVar38,1);
      auVar28 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar38,auVar28);
      auVar48 = vrcpps_avx(auVar21);
      fVar14 = auVar48._0_4_;
      auVar40._0_4_ = auVar21._0_4_ * fVar14;
      fVar17 = auVar48._4_4_;
      auVar40._4_4_ = auVar21._4_4_ * fVar17;
      fVar18 = auVar48._8_4_;
      auVar40._8_4_ = auVar21._8_4_ * fVar18;
      fVar19 = auVar48._12_4_;
      auVar40._12_4_ = auVar21._12_4_ * fVar19;
      auVar21 = vsubps_avx(auVar43,auVar40);
      auVar48 = vrcpps_avx(auVar28);
      fVar50 = auVar48._0_4_;
      auVar34._0_4_ = auVar28._0_4_ * fVar50;
      fVar51 = auVar48._4_4_;
      auVar34._4_4_ = auVar28._4_4_ * fVar51;
      fVar52 = auVar48._8_4_;
      auVar34._8_4_ = auVar28._8_4_ * fVar52;
      fVar53 = auVar48._12_4_;
      auVar34._12_4_ = auVar28._12_4_ * fVar53;
      auVar28 = vsubps_avx(auVar43,auVar34);
      auVar49 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
      fVar50 = fVar50 + fVar50 * auVar28._0_4_;
      fVar51 = fVar51 + fVar51 * auVar28._4_4_;
      fVar52 = fVar52 + fVar52 * auVar28._8_4_;
      fVar53 = fVar53 + fVar53 * auVar28._12_4_;
      auVar28 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar20);
      auVar48 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar20);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar54 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      aVar5.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar28,auVar15);
      fVar27 = fVar27 + fVar27 * auVar36._0_4_;
      fVar30 = fVar30 + fVar30 * auVar36._4_4_;
      fVar31 = fVar31 + fVar31 * auVar36._8_4_;
      fVar32 = fVar32 + fVar32 * auVar36._12_4_;
      auVar28._8_4_ = 0xff800000;
      auVar28._0_8_ = 0xff800000ff800000;
      auVar28._12_4_ = 0xff800000;
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     vblendvps_avx(auVar28,auVar48,auVar15);
      fVar14 = fVar14 + fVar14 * auVar21._0_4_;
      fVar17 = fVar17 + fVar17 * auVar21._4_4_;
      fVar18 = fVar18 + fVar18 * auVar21._8_4_;
      fVar19 = fVar19 + fVar19 * auVar21._12_4_;
      local_1798._0_4_ = auVar15._0_4_ ^ auVar26._0_4_;
      local_1798._4_4_ = auVar15._4_4_ ^ auVar26._4_4_;
      local_1798._8_4_ = auVar15._8_4_ ^ auVar26._8_4_;
      local_1798._12_4_ = auVar15._12_4_ ^ auVar26._12_4_;
      pNVar11 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar9 = &stack_near[2].field_0;
      stack_near[1].field_0 = aVar5;
LAB_00334729:
      auVar15 = auVar44._0_16_;
      paVar9 = paVar9 + -1;
      pNVar1 = pNVar11 + -1;
      pNVar11 = pNVar11 + -1;
      bVar13 = true;
      if (pNVar1->ptr != 0xfffffffffffffff8) {
        auVar16 = ZEXT1664((undefined1  [16])*paVar9);
        auVar26 = vcmpps_avx((undefined1  [16])*paVar9,(undefined1  [16])bi_8.field_0,1);
        sVar7 = pNVar1->ptr;
        if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar26[0xf] < '\0') {
          do {
            auVar26 = auVar46._0_16_;
            auVar28 = auVar47._0_16_;
            auVar48 = auVar49._0_16_;
            if ((sVar7 & 8) != 0) {
              if (sVar7 == 0xfffffffffffffff8) goto LAB_0033488e;
              auVar20 = vcmpps_avx((undefined1  [16])bi_8.field_0,auVar16._0_16_,6);
              if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar20[0xf] < '\0') {
                uVar6 = (ulong)((uint)sVar7 & 0xf);
                valid0.field_0.i[1] = auVar44._4_4_ ^ local_1798._4_4_;
                valid0.field_0.i[0] = auVar44._0_4_ ^ local_1798._0_4_;
                valid0.field_0.i[2] = auVar44._8_4_ ^ local_1798._8_4_;
                valid0.field_0.i[3] = auVar44._12_4_ ^ local_1798._12_4_;
                if (uVar6 == 8) goto LAB_0033495d;
                prim = (Primitive *)(sVar7 & 0xfffffffffffffff0);
                uVar10 = 1;
                goto LAB_00334909;
              }
              break;
            }
            auVar16 = ZEXT1664(auVar54._0_16_);
            uVar6 = 0;
            sVar8 = 8;
            do {
              sVar3 = *(size_t *)((sVar7 & 0xfffffffffffffff0) + uVar6 * 8);
              if (sVar3 != 8) {
                uVar2 = *(undefined4 *)(sVar7 + 0x20 + uVar6 * 4);
                auVar20._4_4_ = uVar2;
                auVar20._0_4_ = uVar2;
                auVar20._8_4_ = uVar2;
                auVar20._12_4_ = uVar2;
                auVar20 = vsubps_avx(auVar20,auVar26);
                auVar29._0_4_ = fVar27 * auVar20._0_4_;
                auVar29._4_4_ = fVar30 * auVar20._4_4_;
                auVar29._8_4_ = fVar31 * auVar20._8_4_;
                auVar29._12_4_ = fVar32 * auVar20._12_4_;
                uVar2 = *(undefined4 *)(sVar7 + 0x40 + uVar6 * 4);
                auVar21._4_4_ = uVar2;
                auVar21._0_4_ = uVar2;
                auVar21._8_4_ = uVar2;
                auVar21._12_4_ = uVar2;
                auVar20 = vsubps_avx(auVar21,auVar28);
                auVar35._0_4_ = fVar50 * auVar20._0_4_;
                auVar35._4_4_ = fVar51 * auVar20._4_4_;
                auVar35._8_4_ = fVar52 * auVar20._8_4_;
                auVar35._12_4_ = fVar53 * auVar20._12_4_;
                uVar2 = *(undefined4 *)(sVar7 + 0x60 + uVar6 * 4);
                auVar22._4_4_ = uVar2;
                auVar22._0_4_ = uVar2;
                auVar22._8_4_ = uVar2;
                auVar22._12_4_ = uVar2;
                auVar20 = vsubps_avx(auVar22,auVar48);
                auVar37._0_4_ = fVar14 * auVar20._0_4_;
                auVar37._4_4_ = fVar17 * auVar20._4_4_;
                auVar37._8_4_ = fVar18 * auVar20._8_4_;
                auVar37._12_4_ = fVar19 * auVar20._12_4_;
                uVar2 = *(undefined4 *)(sVar7 + 0x30 + uVar6 * 4);
                auVar23._4_4_ = uVar2;
                auVar23._0_4_ = uVar2;
                auVar23._8_4_ = uVar2;
                auVar23._12_4_ = uVar2;
                auVar20 = vsubps_avx(auVar23,auVar26);
                auVar39._0_4_ = fVar27 * auVar20._0_4_;
                auVar39._4_4_ = fVar30 * auVar20._4_4_;
                auVar39._8_4_ = fVar31 * auVar20._8_4_;
                auVar39._12_4_ = fVar32 * auVar20._12_4_;
                uVar2 = *(undefined4 *)(sVar7 + 0x50 + uVar6 * 4);
                auVar24._4_4_ = uVar2;
                auVar24._0_4_ = uVar2;
                auVar24._8_4_ = uVar2;
                auVar24._12_4_ = uVar2;
                auVar20 = vsubps_avx(auVar24,auVar28);
                auVar41._0_4_ = fVar50 * auVar20._0_4_;
                auVar41._4_4_ = fVar51 * auVar20._4_4_;
                auVar41._8_4_ = fVar52 * auVar20._8_4_;
                auVar41._12_4_ = fVar53 * auVar20._12_4_;
                uVar2 = *(undefined4 *)(sVar7 + 0x70 + uVar6 * 4);
                auVar25._4_4_ = uVar2;
                auVar25._0_4_ = uVar2;
                auVar25._8_4_ = uVar2;
                auVar25._12_4_ = uVar2;
                auVar20 = vsubps_avx(auVar25,auVar48);
                auVar42._0_4_ = fVar14 * auVar20._0_4_;
                auVar42._4_4_ = fVar17 * auVar20._4_4_;
                auVar42._8_4_ = fVar18 * auVar20._8_4_;
                auVar42._12_4_ = fVar19 * auVar20._12_4_;
                auVar20 = vpminsd_avx(auVar29,auVar39);
                auVar21 = vpminsd_avx(auVar35,auVar41);
                auVar20 = vpmaxsd_avx(auVar20,auVar21);
                auVar21 = vpminsd_avx(auVar37,auVar42);
                auVar21 = vpmaxsd_avx(auVar20,auVar21);
                auVar20 = vpmaxsd_avx(auVar29,auVar39);
                auVar36 = vpmaxsd_avx(auVar35,auVar41);
                auVar33 = vpminsd_avx(auVar20,auVar36);
                auVar20 = vpmaxsd_avx(auVar37,auVar42);
                auVar36 = vpmaxsd_avx(auVar21,(undefined1  [16])aVar5);
                auVar20 = vpminsd_avx(auVar20,(undefined1  [16])bi_8.field_0);
                auVar20 = vpminsd_avx(auVar33,auVar20);
                auVar20 = vcmpps_avx(auVar36,auVar20,2);
                if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar20[0xf] < '\0') {
                  auVar20 = vblendvps_avx(auVar54._0_16_,auVar21,auVar20);
                  if (sVar8 != 8) {
                    pNVar11->ptr = sVar8;
                    pNVar11 = pNVar11 + 1;
                    *paVar9 = auVar16._0_16_;
                    paVar9 = paVar9 + 1;
                  }
                  auVar16 = ZEXT1664(auVar20);
                  sVar8 = sVar3;
                }
              }
            } while ((sVar3 != 8) && (bVar12 = uVar6 < 3, uVar6 = uVar6 + 1, bVar12));
            sVar7 = sVar8;
          } while (sVar8 != 8);
        }
        bVar13 = false;
      }
      goto LAB_0033488e;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar13 = uVar6 - 8 <= uVar10;
    uVar10 = uVar10 + 1;
    if (bVar13) break;
LAB_00334909:
    InstanceIntersectorK<4>::occluded(local_16e8,&valid0,&pre,ray,context,prim);
    auVar15 = auVar44._0_16_;
    aVar4.v = (__m128)vandnps_avx((undefined1  [16])local_16e8,valid0.field_0);
    auVar20 = (undefined1  [16])valid0.field_0 & ~(undefined1  [16])local_16e8;
    valid0.field_0 = aVar4;
    if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar20 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar20 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar20[0xf])
    break;
  }
LAB_0033495d:
  auVar15 = vpcmpeqd_avx(auVar15,auVar15);
  auVar44 = ZEXT1664(auVar15);
  local_1798 = vpor_avx(local_1798,auVar15 ^ (undefined1  [16])valid0.field_0);
  auVar15 = auVar15 & ~local_1798;
  if ((((auVar15 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar15 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar15 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar15[0xf]) {
    auVar45 = ZEXT1664(auVar45._0_16_);
    auVar46 = ZEXT1664(auVar26);
    auVar47 = ZEXT1664(auVar28);
    auVar49 = ZEXT1664(auVar48);
    auVar54 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    bVar13 = true;
  }
  else {
    auVar15._8_4_ = 0xff800000;
    auVar15._0_8_ = 0xff800000ff800000;
    auVar15._12_4_ = 0xff800000;
    bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                   vblendvps_avx((undefined1  [16])bi_8.field_0,auVar15,local_1798);
    bVar13 = false;
    auVar45 = ZEXT1664(auVar45._0_16_);
    auVar46 = ZEXT1664(auVar26);
    auVar47 = ZEXT1664(auVar28);
    auVar49 = ZEXT1664(auVar48);
    auVar54 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
  }
LAB_0033488e:
  if (bVar13) {
    auVar15 = vandps_avx(auVar45._0_16_,local_1798);
    auVar26._8_4_ = 0xff800000;
    auVar26._0_8_ = 0xff800000ff800000;
    auVar26._12_4_ = 0xff800000;
    auVar15 = vmaskmovps_avx(auVar15,auVar26);
    *(undefined1 (*) [16])(ray + 0x80) = auVar15;
    return;
  }
  goto LAB_00334729;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }